

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_immutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,address *addr)

{
  _Rb_tree_header *p_Var1;
  int32_t *piVar2;
  size_t *psVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  _Base_ptr p_Var8;
  _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
  *this_00;
  _Rb_tree_node_base *this_01;
  _Rb_tree_node_base *p_Var9;
  uint uVar10;
  uint uVar11;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *ids;
  undefined1 *puVar13;
  _Rb_tree_node_base *p_Var14;
  _Link_type p_Var15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  span<const_char> buf_00;
  _Base_ptr local_c8;
  char *pcVar12;
  
  p_Var8 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = &p_Var1->_M_header;
  if (p_Var8 != (_Rb_tree_node_base *)0x0) {
    do {
      lVar16 = 0;
      do {
        uVar10 = *(uint *)((long)&p_Var8[1]._M_color + lVar16);
        uVar11 = *(uint *)((long)(target->m_number)._M_elems + lVar16);
        if (uVar10 != uVar11) break;
        bVar17 = lVar16 != 0x10;
        lVar16 = lVar16 + 4;
      } while (bVar17);
      bVar17 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               < (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                 uVar11 << 0x18);
      if (!bVar17) {
        p_Var9 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar17];
    } while (p_Var8 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      lVar16 = 0;
      do {
        uVar10 = *(uint *)((long)(target->m_number)._M_elems + lVar16);
        uVar11 = *(uint *)((long)&p_Var9[1]._M_color + lVar16);
        if (uVar10 != uVar11) break;
        bVar17 = lVar16 != 0x10;
        lVar16 = lVar16 + 4;
      } while (bVar17);
      if ((uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <
          (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18)) {
        p_Var9 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var9 != p_Var1) goto LAB_003a9dea;
    }
  }
  sVar4 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar12 = (char *)buf.m_len;
  iVar6 = (*this->m_settings->_vptr_settings_interface[5])();
  if (iVar6 <= (int)sVar4) {
    p_Var9 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (auVar18 = ::std::_Rb_tree_increment(p_Var9), (_Rb_tree_header *)auVar18._0_8_ != p_Var1)) {
      do {
        p_Var14 = auVar18._0_8_;
        iVar6 = min_distance_exp((dht *)(p_Var14 + 1),(node_id *)&this->m_node_ids,auVar18._8_8_);
        iVar7 = min_distance_exp((dht *)(p_Var9 + 1),(node_id *)&this->m_node_ids,ids);
        uVar10 = *(int *)&p_Var14[6]._M_parent / 5 - iVar6;
        pcVar12 = (char *)(ulong)uVar10;
        if ((int)uVar10 < *(int *)&p_Var9[6]._M_parent / 5 - iVar7) {
          p_Var9 = p_Var14;
        }
        auVar18 = ::std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)auVar18._0_8_ != p_Var1);
    }
    p_Var15 = (_Link_type)p_Var1;
    this_00 = (_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
               *)::std::_Rb_tree_rebalance_for_erase(p_Var9,&p_Var1->_M_header);
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
    ::_M_drop_node(this_00,p_Var15);
    psVar3 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 - 1;
    piVar2 = &(this->m_counters).immutable_data;
    *piVar2 = *piVar2 + -1;
  }
  memset((anon_unknown_0 *)&local_c8,0,0x98);
  buf_00.m_len = (difference_type)pcVar12;
  buf_00.m_ptr = (char *)buf.m_len;
  set_value((anon_unknown_0 *)&local_c8,(dht_immutable_item *)buf.m_ptr,buf_00);
  uVar10 = (target->m_number)._M_elems[4];
  uVar11 = (target->m_number)._M_elems[0];
  uVar5 = (target->m_number)._M_elems[1];
  p_Var8 = *(_Base_ptr *)((target->m_number)._M_elems + 2);
  this_01 = (_Rb_tree_node_base *)operator_new(0xd0);
  p_Var15 = (_Link_type)&stack0xffffffffffffff40;
  *(uint *)&this_01[1]._M_left = uVar10;
  this_01[1]._M_color = uVar11;
  *(uint *)&this_01[1].field_0x4 = uVar5;
  this_01[1]._M_parent = p_Var8;
  this_01[1]._M_right = local_c8;
  memcpy(this_01 + 2,p_Var15,0x90);
  p_Var9 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var1->_M_header;
  if (p_Var9 == (_Rb_tree_node_base *)0x0) {
LAB_003a9d53:
    if (p_Var14 != (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var14);
      goto LAB_003a9d67;
    }
LAB_003a9d8e:
    if (p_Var1 == (_Rb_tree_header *)p_Var14) {
      bVar17 = true;
    }
    else {
      lVar16 = 0;
      do {
        uVar10 = *(uint *)((long)&this_01[1]._M_color + lVar16);
        uVar11 = *(uint *)((long)&p_Var14[1]._M_color + lVar16);
        if (uVar10 != uVar11) break;
        bVar17 = lVar16 != 0x10;
        lVar16 = lVar16 + 4;
      } while (bVar17);
      bVar17 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               < (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                 uVar11 << 0x18);
    }
    ::std::_Rb_tree_insert_and_rebalance(bVar17,this_01,p_Var14,&p_Var1->_M_header);
    psVar3 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 + 1;
    p_Var9 = this_01;
  }
  else {
    do {
      p_Var14 = p_Var9;
      puVar13 = (undefined1 *)0x20;
      do {
        uVar10 = *(uint *)((long)&this_01->_M_color + (long)puVar13);
        uVar11 = *(uint *)((long)&p_Var14->_M_color + (long)puVar13);
        if (uVar10 != uVar11) break;
        p_Var15 = (_Link_type)(puVar13 + 4);
        bVar17 = puVar13 != &DAT_00000030;
        puVar13 = (undefined1 *)p_Var15;
      } while (bVar17);
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      p_Var9 = (&p_Var14->_M_left)[uVar11 <= uVar10];
    } while ((&p_Var14->_M_left)[uVar11 <= uVar10] != (_Base_ptr)0x0);
    p_Var9 = p_Var14;
    if (uVar10 < uVar11) goto LAB_003a9d53;
LAB_003a9d67:
    puVar13 = (undefined1 *)0x20;
    do {
      uVar10 = *(uint *)((long)&p_Var9->_M_color + (long)puVar13);
      uVar11 = *(uint *)((long)&this_01->_M_color + (long)puVar13);
      if (uVar10 != uVar11) break;
      p_Var15 = (_Link_type)(puVar13 + 4);
      bVar17 = puVar13 != &DAT_00000030;
      puVar13 = (undefined1 *)p_Var15;
    } while (bVar17);
    if ((uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <
        (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18))
    goto LAB_003a9d8e;
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
    ::_M_drop_node((_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
                    *)this_01,p_Var15);
  }
  piVar2 = &(this->m_counters).immutable_data;
  *piVar2 = *piVar2 + 1;
LAB_003a9dea:
  touch_item((dht_immutable_item *)&p_Var9[1]._M_right,addr);
  return;
}

Assistant:

void put_immutable_item(sha1_hash const& target
			, span<char const> buf
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_immutable_table.find(target);
			if (i == m_immutable_table.end())
			{
				// make sure we don't add too many items
				if (int(m_immutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_immutable_table);

					TORRENT_ASSERT(j != m_immutable_table.end());
					m_immutable_table.erase(j);
					m_counters.immutable_data -= 1;
				}
				dht_immutable_item to_add;
				set_value(to_add, buf);

				std::tie(i, std::ignore) = m_immutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.immutable_data += 1;
			}

//			std::fprintf(stderr, "added immutable item (%d)\n", int(m_immutable_table.size()));

			touch_item(i->second, addr);
		}